

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O1

void tab_to_next_widget_proc(Am_Object *cmd)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Object cur_inter;
  Am_Object next_widget;
  Am_Object cur_widget;
  Am_Object last_widget;
  Am_Object inter;
  Am_Value_List all_text_widgets;
  Am_Object cur_text;
  Am_Value v;
  Am_String cur_cur_value;
  Am_String old_cur_value;
  Am_Input_Char ic;
  undefined1 local_d8 [16];
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Value_List local_b0;
  Am_Object local_a0;
  Am_Value local_98;
  Am_Object *local_88;
  Am_Object local_80;
  Am_String local_78;
  Am_String local_70;
  Am_Input_Char local_64;
  Am_Object local_60;
  Am_Value local_58;
  Am_Value local_48;
  Am_Object local_38;
  
  local_88 = cmd;
  Am_Object::Get_Object(&local_b8,(Am_Slot_Key)cmd,10);
  bVar1 = Am_Object::Valid(&local_b8);
  if (!bVar1) goto LAB_0025c61f;
  pAVar4 = Am_Object::Get(&local_b8,0x1a9,0);
  Am_Value_List::Am_Value_List(&local_b0,pAVar4);
  local_c0.data = (Am_Object_Data *)0x0;
  local_c8.data = (Am_Object_Data *)0x0;
  local_d8._8_8_ = (Am_List_Item *)0x0;
  local_98.type = 0;
  local_98.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Value_List::Empty(&local_b0);
  if (!bVar1) {
    pAVar4 = Am_Object::Get(local_88,0x1d8,1);
    Am_Value::operator=(&local_98,pAVar4);
    bVar1 = Am_Value::Valid(&local_98);
    if (bVar1) {
      Am_Object::operator=(&local_c0,&local_98);
    }
    Am_Object::Get_Object((Am_Object *)local_d8,(Am_Slot_Key)local_88,10);
    Am_Object::operator=(&local_b8,(Am_Object *)local_d8);
    Am_Object::~Am_Object((Am_Object *)local_d8);
    pAVar4 = Am_Object::Get(&local_b8,0x11b,0);
    Am_Input_Char::Am_Input_Char(&local_64,pAVar4);
    Am_Value_List::Start(&local_b0);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_b0);
      if (bVar1) break;
      pAVar4 = Am_Value_List::Get(&local_b0);
      Am_Object::operator=(&local_c8,pAVar4);
      Am_Object::Get_Object((Am_Object *)local_d8,(Am_Slot_Key)&local_c8,0x1ac);
      Am_Object::operator=(&local_b8,(Am_Object *)local_d8);
      Am_Object::~Am_Object((Am_Object *)local_d8);
      pAVar4 = Am_Object::Get(&local_b8,0x123,1);
      Am_Value::operator=(&local_98,pAVar4);
      bVar2 = Am_Value::Valid(&local_98);
      if (bVar2) {
        iVar3 = Am_Value::operator_cast_to_int(&local_98);
        if (iVar3 == 1) {
          get_next_from((Am_Value_List *)local_d8,SUB81(&local_b0,0));
          Am_Object::operator=((Am_Object *)(local_d8 + 8),(Am_Object *)local_d8);
          Am_Object::~Am_Object((Am_Object *)local_d8);
          break;
        }
      }
      Am_Value_List::Next(&local_b0);
    }
    bVar2 = Am_Object::Valid((Am_Object *)(local_d8 + 8));
    if (!bVar2) {
      bVar2 = Am_Object::Valid(&local_c0);
      if (bVar2) {
        Am_Value_List::Start(&local_b0);
        pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_c0);
        bVar2 = Am_Value_List::Member(&local_b0,pAVar5);
        if (bVar2) {
          get_next_from((Am_Value_List *)local_d8,SUB81(&local_b0,0));
          Am_Object::operator=((Am_Object *)(local_d8 + 8),(Am_Object *)local_d8);
          Am_Object::~Am_Object((Am_Object *)local_d8);
        }
      }
      bVar2 = Am_Object::Valid((Am_Object *)(local_d8 + 8));
      if (!bVar2) {
        Am_Value_List::Start(&local_b0);
        pAVar4 = Am_Value_List::Get(&local_b0);
        Am_Object::operator=((Am_Object *)(local_d8 + 8),pAVar4);
      }
    }
    if (bVar1) {
LAB_0025c394:
      bVar1 = Am_Object::Valid(&local_c0);
      if (bVar1) {
        Am_Object::Set(&local_c0,0x17c,false,0);
      }
      bVar1 = Am_Object::Valid((Am_Object *)(local_d8 + 8));
      if (bVar1) {
        find_next_active_widget((Am_Object *)local_d8,(Am_Value_List *)(local_d8 + 8));
        Am_Object::operator=((Am_Object *)(local_d8 + 8),(Am_Object *)local_d8);
        Am_Object::~Am_Object((Am_Object *)local_d8);
        bVar1 = Am_Object::Valid((Am_Object *)(local_d8 + 8));
        if (bVar1) {
          pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)(local_d8 + 8));
          Am_Object::Set(local_88,0x1d8,pAVar5,1);
          Am_Object::Set((Am_Object *)(local_d8 + 8),0x17c,true,0);
          Am_Object::Am_Object(&local_80,(Am_Object *)(local_d8 + 8));
          Am_Value::Am_Value(&local_58,&Am_No_Value);
          Am_Start_Widget(&local_80,&local_58);
          Am_Value::~Am_Value(&local_58);
          pAVar6 = &local_80;
          goto LAB_0025c54c;
        }
      }
    }
    else {
      Am_Object::Get_Object((Am_Object *)local_d8,(Am_Slot_Key)&local_c8,0x1ac);
      Am_Object::Get_Object(&local_a0,(Am_Slot_Key)&local_c8,0x1d7);
      bVar1 = check_value_legal(&local_a0,(Am_Object *)local_d8);
      if (bVar1) {
        pAVar4 = Am_Object::Get((Am_Object *)local_d8,0x16c,0);
        Am_String::Am_String(&local_70,pAVar4);
        pAVar4 = Am_Object::Get(&local_a0,0xab,0);
        Am_String::Am_String(&local_78,pAVar4);
        bVar2 = Am_String::operator==(&local_70,&local_78);
        if (bVar2) {
          pAVar6 = &local_38;
          Am_Object::Am_Object(pAVar6,&local_b8);
          Am_Abort_Interactor(pAVar6,true);
        }
        else {
          Am_Object::Am_Object(&local_60,&local_c8);
          Am_Value::Am_Value(&local_48,&Am_No_Value);
          pAVar6 = &local_60;
          Am_Stop_Widget(pAVar6,&local_48);
          Am_Value::~Am_Value(&local_48);
        }
        Am_Object::~Am_Object(pAVar6);
        Am_Object::Set(&local_c8,0x17c,false,0);
        Am_String::~Am_String(&local_78);
        Am_String::~Am_String(&local_70);
        Am_Object::~Am_Object(&local_a0);
        Am_Object::~Am_Object((Am_Object *)local_d8);
        if (!bVar1) goto LAB_0025c5ed;
        goto LAB_0025c394;
      }
      Am_Object::~Am_Object(&local_a0);
      pAVar6 = (Am_Object *)local_d8;
LAB_0025c54c:
      Am_Object::~Am_Object(pAVar6);
    }
  }
LAB_0025c5ed:
  Am_Value::~Am_Value(&local_98);
  Am_Object::~Am_Object((Am_Object *)(local_d8 + 8));
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_c0);
  Am_Value_List::~Am_Value_List(&local_b0);
LAB_0025c61f:
  Am_Object::~Am_Object(&local_b8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, tab_to_next_widget, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  if (inter.Valid()) {
    Am_Value_List all_text_widgets = inter.Get(Am_LIST_OF_TEXT_WIDGETS);
    Am_Object last_widget, cur_widget, next_widget;
    bool forward;
    bool running = false;
    Am_Value v;
    if (all_text_widgets.Empty())
      return; //nothing to do
    v = cmd.Peek(Am_LAST_TEXT_WIDGET);
    if (v.Valid())
      last_widget = v;
    // see if going forward or backwards
    inter = cmd.Get_Owner();
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    //go forward if not shifted
    forward = !ic.shift;
    // search to see which part is active, if any
    for (all_text_widgets.Start(); !all_text_widgets.Last();
         all_text_widgets.Next()) {
      cur_widget = all_text_widgets.Get();
      inter = cur_widget.Get_Object(Am_INTERACTOR);
      v = inter.Peek(Am_CURRENT_STATE);
      if (v.Valid() && (int)v == 1) { //then this is it
        running = true;
        next_widget = get_next_from(all_text_widgets, forward);
        break;
      }
    }
    if (!next_widget.Valid()) {
      //nothing running, see if have current
      if (last_widget.Valid()) {
        all_text_widgets.Start();
        if (all_text_widgets.Member(last_widget)) {
          next_widget = get_next_from(all_text_widgets, forward);
        }
      }
      if (!next_widget.Valid()) // just use first in the list
      {
        all_text_widgets.Start();
        next_widget = all_text_widgets.Get();
      }
    }
    if (running) {
      //check to see whether current value is legal and if not, don't go on
      Am_Object cur_inter = cur_widget.Get_Object(Am_INTERACTOR);
      Am_Object cur_text = cur_widget.Get_Object(Am_TEXT_WIDGET_TEXT_OBJ);
      if (!check_value_legal(cur_text, cur_inter))
        return;
      //check if old value same as current, in which case, abort so
      //command not queued for undo
      Am_String old_cur_value = cur_inter.Get(Am_OLD_VALUE);
      Am_String cur_cur_value = cur_text.Get(Am_TEXT);
      if (old_cur_value == cur_cur_value)
        Am_Abort_Interactor(inter);
      else
        Am_Stop_Widget(cur_widget);

      cur_widget.Set(Am_KEY_SELECTED, false);
    }
    if (last_widget.Valid())
      last_widget.Set(Am_KEY_SELECTED, false);

    if (next_widget.Valid()) {
      next_widget = find_next_active_widget(next_widget, all_text_widgets);
      if (next_widget.Valid()) {
        cmd.Set(Am_LAST_TEXT_WIDGET, next_widget, Am_OK_IF_NOT_THERE);
        next_widget.Set(Am_KEY_SELECTED, true);
        Am_Start_Widget(next_widget);
      }
    }
  }
}